

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_ray_hit_info *
rf_collision_ray_triangle
          (rf_ray_hit_info *__return_storage_ptr__,rf_ray ray,rf_vec3 p1,rf_vec3 p2,rf_vec3 p3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  rf_vec3 rVar4;
  rf_vec3 v2;
  rf_vec3 rVar5;
  rf_vec3 v1;
  float t;
  float v;
  float u;
  float inv_det;
  float det;
  rf_vec3 tv;
  rf_vec3 q;
  rf_vec3 p;
  rf_vec3 edge2;
  rf_vec3 edge1;
  rf_vec3 p3_local;
  rf_vec3 p2_local;
  rf_vec3 p1_local;
  
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  (__return_storage_ptr__->normal).y = 0.0;
  (__return_storage_ptr__->normal).z = 0.0;
  __return_storage_ptr__->hit = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  __return_storage_ptr__->distance = 0.0;
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  rVar4 = rf_vec3_sub(p2,p1);
  v2 = rf_vec3_sub(p3,p1);
  rVar5 = rf_vec3_cross_product(ray.direction,v2);
  fVar1 = rf_vec3_dot_product(rVar4,rVar5);
  if ((fVar1 <= -1e-06) || (1e-06 <= fVar1)) {
    fVar1 = 1.0 / fVar1;
    v1 = rf_vec3_sub(ray.position,p1);
    fVar2 = rf_vec3_dot_product(v1,rVar5);
    fVar2 = fVar2 * fVar1;
    if ((0.0 <= fVar2) && (fVar2 <= 1.0)) {
      rVar5 = rf_vec3_cross_product(v1,rVar4);
      fVar3 = rf_vec3_dot_product(ray.direction,rVar5);
      if ((0.0 <= fVar3 * fVar1) && (fVar2 + fVar3 * fVar1 <= 1.0)) {
        fVar2 = rf_vec3_dot_product(v2,rVar5);
        fVar2 = fVar2 * fVar1;
        if (1e-06 < fVar2) {
          __return_storage_ptr__->hit = true;
          __return_storage_ptr__->distance = fVar2;
          __return_storage_ptr__->hit = true;
          rVar4 = rf_vec3_cross_product(rVar4,v2);
          rVar4 = rf_vec3_normalize(rVar4);
          (__return_storage_ptr__->normal).z = rVar4.z;
          (__return_storage_ptr__->normal).x = (float)(int)rVar4._0_8_;
          (__return_storage_ptr__->normal).y = (float)(int)((ulong)rVar4._0_8_ >> 0x20);
          rVar4 = rf_vec3_scale(ray.direction,fVar2);
          rVar4 = rf_vec3_add(ray.position,rVar4);
          (__return_storage_ptr__->position).x = (float)(int)rVar4._0_8_;
          (__return_storage_ptr__->position).y = (float)(int)((ulong)rVar4._0_8_ >> 0x20);
          (__return_storage_ptr__->position).z = rVar4.z;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_triangle(rf_ray ray, rf_vec3 p1, rf_vec3 p2, rf_vec3 p3)
{
#define rf_epsilon 0.000001 // Just a small number

    rf_vec3 edge1, edge2;
    rf_vec3 p, q, tv;
    float det, inv_det, u, v, t;
    rf_ray_hit_info result = {0};

// Find vectors for two edges sharing V1
    edge1 = rf_vec3_sub(p2, p1);
    edge2 = rf_vec3_sub(p3, p1);

// Begin calculating determinant - also used to calculate u parameter
    p = rf_vec3_cross_product(ray.direction, edge2);

// If determinant is near zero, ray lies in plane of triangle or ray is parallel to plane of triangle
    det = rf_vec3_dot_product(edge1, p);

// Avoid culling!
    if ((det > -rf_epsilon) && (det < rf_epsilon)) return result;

    inv_det = 1.0f / det;

// Calculate distance from V1 to ray origin
    tv = rf_vec3_sub(ray.position, p1);

// Calculate u parameter and test bound
    u = rf_vec3_dot_product(tv, p) * inv_det;

// The intersection lies outside of the triangle
    if ((u < 0.0f) || (u > 1.0f)) return result;

// Prepare to test v parameter
    q = rf_vec3_cross_product(tv, edge1);

// Calculate V parameter and test bound
    v = rf_vec3_dot_product(ray.direction, q) * inv_det;

// The intersection lies outside of the triangle
    if ((v < 0.0f) || ((u + v) > 1.0f)) return result;

    t = rf_vec3_dot_product(edge2, q) * inv_det;

    if (t > rf_epsilon)
    {
// rf_ray hit, get hit point and normal
        result.hit = true;
        result.distance = t;
        result.hit = true;
        result.normal = rf_vec3_normalize(rf_vec3_cross_product(edge1, edge2));
        result.position = rf_vec3_add(ray.position, rf_vec3_scale(ray.direction, t));
    }

    return result;
}